

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

RtreeNode * rtreeNodeOfFirstSearchPoint(RtreeCursor *pCur,int *pRC)

{
  int iVar1;
  int iVar2;
  i64 local_30;
  int ii;
  sqlite3_int64 id;
  int *pRC_local;
  RtreeCursor *pCur_local;
  
  iVar1 = 1 - (uint)pCur->bPoint;
  if (pCur->aNode[iVar1] == (RtreeNode *)0x0) {
    if (iVar1 == 0) {
      local_30 = (pCur->sPoint).id;
    }
    else {
      local_30 = pCur->aPoint->id;
    }
    iVar2 = nodeAcquire((Rtree *)(pCur->base).pVtab,local_30,(RtreeNode *)0x0,pCur->aNode + iVar1);
    *pRC = iVar2;
  }
  return pCur->aNode[iVar1];
}

Assistant:

static RtreeNode *rtreeNodeOfFirstSearchPoint(RtreeCursor *pCur, int *pRC){
  sqlite3_int64 id;
  int ii = 1 - pCur->bPoint;
  assert( ii==0 || ii==1 );
  assert( pCur->bPoint || pCur->nPoint );
  if( pCur->aNode[ii]==0 ){
    assert( pRC!=0 );
    id = ii ? pCur->aPoint[0].id : pCur->sPoint.id;
    *pRC = nodeAcquire(RTREE_OF_CURSOR(pCur), id, 0, &pCur->aNode[ii]);
  }
  return pCur->aNode[ii];
}